

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

fdb_status
wal_txn_migration(void *dbhandle,void *new_dhandle,filemgr *old_file,filemgr *new_file,
                 wal_doc_move_func *move_doc)

{
  atomic<unsigned_int> *paVar1;
  atomic<unsigned_long> *paVar2;
  ulong uVar3;
  fdb_kvs_handle *pfVar4;
  avl_node *paVar5;
  list_elem *plVar6;
  avl_node *node;
  avl_node *paVar7;
  uint64_t offset;
  wal_item *pwVar8;
  wal *pwVar9;
  list_elem *plVar10;
  ulong uVar11;
  long lVar12;
  fdb_txn *txn;
  wal_item *e;
  ulong uVar13;
  list_elem *e_00;
  _fdb_key_cmp_info cmp_info;
  fdb_doc doc;
  _fdb_key_cmp_info local_a8;
  fdb_doc local_80;
  
  pwVar9 = old_file->wal;
  uVar3 = pwVar9->num_shards;
  if (uVar3 == 0) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    uVar13 = 0;
    do {
      pthread_spin_lock(&old_file->wal->key_shards[uVar13].lock);
      paVar7 = avl_first(&old_file->wal->key_shards[uVar13]._map);
      while (node = paVar7, node != (avl_node *)0x0) {
        if ((wal_item *)node[2].parent != (wal_item *)0x0) {
          e = (wal_item *)node[2].parent;
          do {
            if (((e->flag).super___atomic_base<unsigned_char>._M_i & 1) == 0) {
              offset = (*move_doc)(dbhandle,new_dhandle,e,&local_80);
              if ((long)offset < 1) {
                pthread_spin_unlock(&old_file->wal->key_shards[uVar13].lock);
                if (offset == 0) {
                  return FDB_RESULT_READ_FAIL;
                }
                return (fdb_status)offset;
              }
              txn = e->txn;
              if (txn == &old_file->global_txn) {
                fdb_assert_die("item->txn != &old_file->global_txn",
                               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                               ,0x48b,(uint64_t)&old_file->global_txn,0);
                txn = e->txn;
              }
              pfVar4 = txn->handle;
              local_a8.kvs_config.custom_cmp_param = (pfVar4->kvs_config).custom_cmp_param;
              local_a8.kvs_config.create_if_missing = (pfVar4->kvs_config).create_if_missing;
              local_a8.kvs_config._1_7_ = *(undefined7 *)&(pfVar4->kvs_config).field_0x1;
              local_a8.kvs_config.custom_cmp = (pfVar4->kvs_config).custom_cmp;
              local_a8.kvs = txn->handle->kvs;
              _wal_insert(txn,new_file,&local_a8,&local_80,offset,0,false);
              if (old_file->config->seqtree_opt == '\x01') {
                uVar11 = e->seqnum % uVar3;
                pthread_spin_lock(&old_file->wal->seq_shards[uVar11].lock);
                avl_remove(&old_file->wal->seq_shards[uVar11]._map,&e->avl_seq);
                pthread_spin_unlock(&old_file->wal->seq_shards[uVar11].lock);
              }
              pwVar8 = (wal_item *)list_remove_reverse((list *)&node[1].right,&e->list_elem);
              list_remove(e->txn->items,&(e->field_12).list_elem_txn);
              if (e->txn_id == (old_file->global_txn).txn_id) {
                LOCK();
                paVar1 = &old_file->wal->num_flushable;
                (paVar1->super___atomic_base<unsigned_int>)._M_i =
                     (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
                UNLOCK();
              }
              if (e->action != '\x02') {
                LOCK();
                paVar2 = &old_file->wal->datasize;
                (paVar2->super___atomic_base<unsigned_long>)._M_i =
                     (paVar2->super___atomic_base<unsigned_long>)._M_i - (ulong)e->doc_size;
                UNLOCK();
              }
              free(e);
              free(local_80.key);
              free(local_80.meta);
              free(local_80.body);
              LOCK();
              paVar1 = &old_file->wal->size;
              (paVar1->super___atomic_base<unsigned_int>)._M_i =
                   (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
              UNLOCK();
              lVar12 = lVar12 + 0x80;
            }
            else {
              pwVar8 = (wal_item *)(e->list_elem).prev;
            }
            e = pwVar8;
          } while (pwVar8 != (wal_item *)0x0);
        }
        paVar5 = node[1].right;
        paVar7 = avl_next(node);
        if (paVar5 == (avl_node *)0x0) {
          avl_remove(&old_file->wal->key_shards[uVar13]._map,node);
          lVar12 = lVar12 + (ulong)*(ushort *)&node[1].left + 0x38;
          free(node[1].parent);
          free(node);
        }
      }
      pthread_spin_unlock(&old_file->wal->key_shards[uVar13].lock);
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar3);
    pwVar9 = old_file->wal;
  }
  LOCK();
  (pwVar9->mem_overhead).super___atomic_base<unsigned_long>._M_i =
       (pwVar9->mem_overhead).super___atomic_base<unsigned_long>._M_i - lVar12;
  UNLOCK();
  pthread_spin_lock(&old_file->wal->lock);
  pwVar9 = old_file->wal;
  e_00 = (pwVar9->txn_list).head;
  if (e_00 != (list_elem *)0x0) {
    do {
      plVar6 = e_00[1].prev;
      if ((fdb_txn *)plVar6 == &old_file->global_txn) {
        plVar10 = e_00->next;
      }
      else {
        plVar10 = list_remove(&old_file->wal->txn_list,e_00);
        list_push_front(&new_file->wal->txn_list,e_00);
        plVar6[1].prev = (list_elem *)0xffffffffffffffff;
        plVar6[1].next = (list_elem *)0x0;
      }
      e_00 = plVar10;
    } while (plVar10 != (list_elem *)0x0);
    pwVar9 = old_file->wal;
  }
  pthread_spin_unlock(&pwVar9->lock);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_txn_migration(void *dbhandle,
                             void *new_dhandle,
                             struct filemgr *old_file,
                             struct filemgr *new_file,
                             wal_doc_move_func *move_doc)
{
    int64_t offset;
    fdb_doc doc;
    fdb_txn *txn;
    struct wal_txn_wrapper *txn_wrapper;
    struct wal_item_header *header;
    struct wal_item *item;
    struct avl_node *node;
    struct list_elem *e;
    size_t i = 0;
    size_t num_shards = old_file->wal->num_shards;
    uint64_t mem_overhead = 0;
    struct _fdb_key_cmp_info cmp_info;

    // Note that the caller (i.e., compactor) alreay owns the locks on
    // both old_file and new_file filemgr instances. Therefore, it is OK to
    // grab each partition lock individually and move all uncommitted items
    // to the new_file filemgr instance.

    for (; i < num_shards; ++i) {
        spin_lock(&old_file->wal->key_shards[i].lock);
        node = avl_first(&old_file->wal->key_shards[i]._map);
        while(node) {
            header = _get_entry(node, struct wal_item_header, avl_key);
            e = list_end(&header->items);
            while(e) {
                item = _get_entry(e, struct wal_item, list_elem);
                if (!(item->flag & WAL_ITEM_COMMITTED)) {
                    // not committed yet
                    // move doc
                    offset = move_doc(dbhandle, new_dhandle, item, &doc);
                    if (offset <= 0) {
                        spin_unlock(&old_file->wal->key_shards[i].lock);
                        return offset < 0 ? (fdb_status) offset : FDB_RESULT_READ_FAIL;
                    }
                    // Note that all items belonging to global_txn should be
                    // flushed before calling this function
                    // (migrate transactional items only).
                    fdb_assert(item->txn != &old_file->global_txn,
                               (uint64_t)item->txn, 0);
                    cmp_info.kvs_config = item->txn->handle->kvs_config;
                    cmp_info.kvs = item->txn->handle->kvs;
                    // insert into new_file's WAL
                    wal_insert(item->txn, new_file, &cmp_info, &doc, offset,
                               WAL_INS_WRITER);

                    if (old_file->config->seqtree_opt == FDB_SEQTREE_USE) {
                        // remove from seq map
                        size_t shard_num = item->seqnum % num_shards;
                        spin_lock(&old_file->wal->seq_shards[shard_num].lock);
                        avl_remove(&old_file->wal->seq_shards[shard_num]._map,
                                &item->avl_seq);
                        spin_unlock(&old_file->wal->seq_shards[shard_num].lock);
                    }

                    // remove from header's list
                    e = list_remove_reverse(&header->items, e);
                    // remove from transaction's list
                    list_remove(item->txn->items, &item->list_elem_txn);
                    // decrease num_flushable of old_file if non-transactional update
                    if (item->txn_id == old_file->global_txn.txn_id) {
                        atomic_decr_uint32_t(&old_file->wal->num_flushable);
                    }
                    if (item->action != WAL_ACT_REMOVE) {
                        atomic_sub_uint64_t(&old_file->wal->datasize, item->doc_size,
                                            std::memory_order_relaxed);
                    }
                    // free item
                    free(item);
                    // free doc
                    free(doc.key);
                    free(doc.meta);
                    free(doc.body);
                    atomic_decr_uint32_t(&old_file->wal->size);
                    mem_overhead += sizeof(struct wal_item);
                } else {
                    e = list_prev(e);
                }
            }

            if (list_begin(&header->items) == NULL) {
                // header's list becomes empty
                // remove from key map
                node = avl_next(node);
                avl_remove(&old_file->wal->key_shards[i]._map,
                           &header->avl_key);
                mem_overhead += header->keylen + sizeof(struct wal_item_header);
                // free key & header
                free(header->key);
                free(header);
            } else {
                node = avl_next(node);
            }
        }
        spin_unlock(&old_file->wal->key_shards[i].lock);
    }
    atomic_sub_uint64_t(&old_file->wal->mem_overhead, mem_overhead,
                        std::memory_order_relaxed);

    spin_lock(&old_file->wal->lock);

    // migrate all entries in txn list
    e = list_begin(&old_file->wal->txn_list);
    while(e) {
        txn_wrapper = _get_entry(e, struct wal_txn_wrapper, le);
        txn = txn_wrapper->txn;
        // except for global_txn
        if (txn != &old_file->global_txn) {
            e = list_remove(&old_file->wal->txn_list, &txn_wrapper->le);
            list_push_front(&new_file->wal->txn_list, &txn_wrapper->le);
            // remove previous header info & revnum
            txn->prev_hdr_bid = BLK_NOT_FOUND;
            txn->prev_revnum = 0;
        } else {
            e = list_next(e);
        }
    }

    spin_unlock(&old_file->wal->lock);

    return FDB_RESULT_SUCCESS;
}